

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QTransform>::reallocateAndGrow
          (QArrayDataPointer<QTransform> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QTransform> *old)

{
  QArrayData *pQVar1;
  bool bVar2;
  QTransform *pQVar3;
  long lVar4;
  qsizetype qVar5;
  QTransform *pQVar6;
  QTransform *pQVar7;
  QTransform *pQVar8;
  QTransform *pQVar9;
  long in_FS_OFFSET;
  byte bVar10;
  undefined1 auVar11 [16];
  QArrayDataPointer<QTransform> local_38;
  long local_20;
  
  bVar10 = 0;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QTransform> *)0x0 && where == GrowsAtEnd) {
    pQVar1 = &this->d->super_QArrayData;
    if (pQVar1 == (QArrayData *)0x0) {
      bVar2 = true;
    }
    else {
      bVar2 = 1 < (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar2)) {
      if (pQVar1 == (QArrayData *)0x0) {
        qVar5 = 0;
        lVar4 = 0;
      }
      else {
        qVar5 = pQVar1->alloc;
        lVar4 = (this->size - pQVar1->alloc) +
                ((long)((long)this->ptr -
                       ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
                -0x3333333333333333;
      }
      auVar11 = QArrayData::reallocateUnaligned(pQVar1,this->ptr,0x50,qVar5 + n + lVar4,Grow);
      this->d = (Data *)auVar11._0_8_;
      this->ptr = (QTransform *)auVar11._8_8_;
      goto LAB_004820d1;
    }
  }
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QTransform *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if (this->size != 0) {
    lVar4 = this->size + (n >> 0x3f & n);
    if (this->d == (Data *)0x0) {
      bVar2 = true;
    }
    else {
      bVar2 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    pQVar3 = this->ptr;
    pQVar9 = pQVar3 + lVar4;
    if ((old != (QArrayDataPointer<QTransform> *)0x0) || (bVar2)) {
      if ((lVar4 != 0) && (0 < lVar4)) {
        pQVar6 = local_38.ptr + local_38.size;
        do {
          pQVar7 = pQVar3;
          pQVar8 = pQVar6;
          for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
            pQVar8->m_matrix[0][0] = pQVar7->m_matrix[0][0];
            pQVar7 = (QTransform *)((long)pQVar7 + ((ulong)bVar10 * -2 + 1) * 8);
            pQVar8 = (QTransform *)((long)pQVar8 + ((ulong)bVar10 * -2 + 1) * 8);
          }
          pQVar3 = pQVar3 + 1;
          local_38.size = local_38.size + 1;
          pQVar6 = pQVar6 + 1;
        } while (pQVar3 < pQVar9);
      }
    }
    else if ((lVar4 != 0) && (0 < lVar4)) {
      pQVar6 = local_38.ptr + local_38.size;
      do {
        pQVar7 = pQVar3;
        pQVar8 = pQVar6;
        for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
          pQVar8->m_matrix[0][0] = pQVar7->m_matrix[0][0];
          pQVar7 = (QTransform *)((long)pQVar7 + ((ulong)bVar10 * -2 + 1) * 8);
          pQVar8 = (QTransform *)((long)pQVar8 + ((ulong)bVar10 * -2 + 1) * 8);
        }
        pQVar3 = pQVar3 + 1;
        local_38.size = local_38.size + 1;
        pQVar6 = pQVar6 + 1;
      } while (pQVar3 < pQVar9);
    }
  }
  pQVar1 = &this->d->super_QArrayData;
  pQVar3 = this->ptr;
  *(undefined4 *)&this->d = local_38.d._0_4_;
  *(undefined4 *)((long)&this->d + 4) = local_38.d._4_4_;
  *(undefined4 *)&this->ptr = local_38.ptr._0_4_;
  *(undefined4 *)((long)&this->ptr + 4) = local_38.ptr._4_4_;
  qVar5 = this->size;
  this->size = local_38.size;
  local_38.d = (Data *)pQVar1;
  local_38.ptr = pQVar3;
  local_38.size = qVar5;
  if (old != (QArrayDataPointer<QTransform> *)0x0) {
    local_38.d = old->d;
    local_38.ptr = old->ptr;
    old->d = (Data *)pQVar1;
    old->ptr = pQVar3;
    local_38.size = old->size;
    old->size = qVar5;
  }
  if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d)->super_QArrayData,0x50,0x10);
    }
  }
LAB_004820d1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }